

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O0

LPVOID __thiscall
Memory::PreReservedVirtualAllocWrapper::EnsurePreReservedRegionInternal
          (PreReservedVirtualAllocWrapper *this)

{
  bool bVar1;
  uint uVar2;
  size_t bytes;
  LPVOID startAddress;
  PreReservedVirtualAllocWrapper *this_local;
  
  this_local = (PreReservedVirtualAllocWrapper *)this->preReservedStartAddress;
  if (this_local == (PreReservedVirtualAllocWrapper *)0x0) {
    uVar2 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,PreReservedHeapAllocPhase);
    if (bVar1) {
      this_local = (PreReservedVirtualAllocWrapper *)
                   VirtualAlloc((LPVOID)0x0,(ulong)(uVar2 << 0xc),0x2000,4);
      Output::Trace(PreReservedHeapAllocPhase,
                    L"Reserving PreReservedSegment For the first time(CFG Non-Enabled). Address: 0x%p\n"
                    ,this->preReservedStartAddress);
      this->preReservedStartAddress = this_local;
    }
  }
  return this_local;
}

Assistant:

LPVOID PreReservedVirtualAllocWrapper::EnsurePreReservedRegionInternal()
{
    LPVOID startAddress = preReservedStartAddress;
    if (startAddress != nullptr)
    {
        return startAddress;
    }

    //PreReserve a (bigger) segment
    size_t bytes = PreReservedAllocationSegmentCount * AutoSystemInfo::Data.GetAllocationGranularityPageSize();
    if (PHASE_FORCE1(Js::PreReservedHeapAllocPhase))
    {
        //This code is used where CFG is not available, but still PreReserve optimization for CFG can be tested
        startAddress = VirtualAlloc(NULL, bytes, MEM_RESERVE, PAGE_READWRITE);
        PreReservedHeapTrace(_u("Reserving PreReservedSegment For the first time(CFG Non-Enabled). Address: 0x%p\n"), preReservedStartAddress);
        preReservedStartAddress = startAddress;
        return startAddress;
    }

#if defined(_CONTROL_FLOW_GUARD)
    bool supportPreReservedRegion = true;
#if !TARGET_64
#if _M_IX86
    // We want to restrict the number of prereserved segment for 32-bit process so that we don't use up the address space

    // Note: numPreReservedSegment is for the whole process, and access and update to it is not protected by a global lock.
    // So we may allocate more than the maximum some of the time if multiple thread check it simutaniously and allocate pass the limit.
    // It doesn't affect functionally, and it should be OK if we exceed.

    if (PreReservedVirtualAllocWrapper::numPreReservedSegment > PreReservedVirtualAllocWrapper::MaxPreReserveSegment)
    {
        supportPreReservedRegion = false;
    }
#else
    // TODO: fast check for prereserved segment is not implementated in ARM yet, so it is only enabled for x86
    supportPreReservedRegion = false;
#endif // _M_IX86
#endif

    if (GlobalSecurityPolicy::IsCFGEnabled() && supportPreReservedRegion)
    {
        startAddress = VirtualAlloc(NULL, bytes, MEM_RESERVE, PAGE_READWRITE);
        PreReservedHeapTrace(_u("Reserving PreReservedSegment For the first time(CFG Enabled). Address: 0x%p\n"), preReservedStartAddress);
        preReservedStartAddress = startAddress;

#if !TARGET_64
        if (startAddress)
        {
            InterlockedIncrement(&PreReservedVirtualAllocWrapper::numPreReservedSegment);
        }
#endif
    }
#endif


    return startAddress;
}